

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

ssize_t __thiscall QMetaProperty::write(QMetaProperty *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  StaticMetacallFunction p_Var4;
  undefined1 auVar5 [12];
  bool bVar6;
  int iVar7;
  QMetaObject *pQVar8;
  unsigned_long_long *puVar9;
  undefined8 uVar10;
  undefined4 extraout_var_00;
  ssize_t sVar11;
  undefined7 extraout_var;
  undefined4 in_register_00000034;
  QObject *object;
  char *pcVar12;
  long in_FS_OFFSET;
  optional<unsigned_long_long> oVar13;
  int flags;
  int status;
  QMetaType local_70;
  QMetaType local_68;
  undefined1 *puStack_60;
  InterfaceType *local_58 [3];
  int *local_40;
  long local_38;
  
  object = (QObject *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((object == (QObject *)0x0) || (pQVar8 = this->mobj, pQVar8 == (QMetaObject *)0x0)) ||
     (puVar2 = (this->data).d, (puVar2[2] & 2) == 0)) {
LAB_00263bbc:
    sVar11 = 0;
  }
  else {
    puVar3 = (pQVar8->d).data;
    local_70.d_ptr =
         (pQVar8->d).metaTypes
         [(ulong)((int)((ulong)((long)puVar2 - (long)puVar3) >> 2) - puVar3[7]) / 5];
    local_58[0] = &QtPrivate::QMetaTypeInterfaceWrapper<QVariant>::metaType;
    bVar6 = ::operator!=(&local_70,(QMetaType *)local_58);
    if (bVar6) {
      local_68 = ::QVariant::metaType((QVariant *)__buf);
      bVar6 = ::operator!=(&local_70,&local_68);
      if (bVar6) {
        bVar6 = isEnumType(this);
        if ((bVar6) &&
           (((local_70.d_ptr == (QMetaTypeInterface *)0x0 ||
             ((local_70.d_ptr)->metaObjectFn == (MetaObjectFn)0x0)) ||
            (pQVar8 = (*(local_70.d_ptr)->metaObjectFn)(local_70.d_ptr),
            pQVar8 == (QMetaObject *)0x0)))) {
          local_58[0] = (InterfaceType *)::QVariant::metaType((QVariant *)__buf);
          local_68.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
          bVar6 = ::comparesEqual((QMetaType *)local_58,&local_68);
          if (bVar6) {
            local_68.d_ptr = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
            puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
            bVar6 = isFlagType(this);
            if (bVar6) {
              ::QVariant::toByteArray((QByteArray *)local_58,(QVariant *)__buf);
              pcVar12 = (char *)local_58[1];
              if (local_58[1] == (InterfaceType *)0x0) {
                pcVar12 = &QByteArray::_empty;
              }
              oVar13 = QMetaEnum::keysToValue64(&this->menum,pcVar12);
              auVar5 = oVar13.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_long_long>._0_12_;
            }
            else {
              ::QVariant::toByteArray((QByteArray *)local_58,(QVariant *)__buf);
              pcVar12 = (char *)local_58[1];
              if (local_58[1] == (InterfaceType *)0x0) {
                pcVar12 = &QByteArray::_empty;
              }
              oVar13 = QMetaEnum::keyToValue64(&this->menum,pcVar12);
              auVar5 = oVar13.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_long_long>._0_12_;
            }
            local_68.d_ptr = auVar5._0_8_;
            puStack_60 = (undefined1 *)CONCAT71(puStack_60._1_7_,auVar5[8]);
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_58);
            if ((auVar5 & (undefined1  [12])0x1) != (undefined1  [12])0x0) {
              puVar9 = std::
                       _Optional_base_impl<unsigned_long_long,_std::_Optional_base<unsigned_long_long,_true,_true>_>
                       ::_M_get((_Optional_base_impl<unsigned_long_long,_std::_Optional_base<unsigned_long_long,_true,_true>_>
                                 *)&local_68);
              ::QVariant::QVariant((QVariant *)local_58,*puVar9);
              ::QVariant::operator=((QVariant *)__buf,(QVariant *)local_58);
              ::QVariant::~QVariant((QVariant *)local_58);
            }
          }
        }
        if (*(ulong *)((long)__buf + 0x18) < 4) {
          if ((this->mobj != (QMetaObject *)0x0) && (((this->data).d[2] & 4) != 0)) {
            bVar6 = reset(this,object);
            sVar11 = CONCAT71(extraout_var,bVar6);
            goto LAB_00263bbe;
          }
          ::QVariant::QVariant((QVariant *)local_58,local_70,(void *)0x0);
          ::QVariant::operator=((QVariant *)__buf,(QVariant *)local_58);
          ::QVariant::~QVariant((QVariant *)local_58);
        }
        else {
          bVar6 = ::QVariant::convert((QVariant *)__buf,local_70);
          if (!bVar6) goto LAB_00263bbc;
        }
      }
    }
    local_58[2] = (InterfaceType *)&status;
    status = -1;
    local_40 = &flags;
    flags = 0;
    local_68.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QVariant>::metaType;
    local_58[1] = (InterfaceType *)__buf;
    bVar6 = ::comparesEqual(&local_70,&local_68);
    if (!bVar6) {
      __buf = ::QVariant::data((QVariant *)__buf);
    }
    pQVar8 = this->mobj;
    puVar2 = (pQVar8->d).data;
    local_58[0] = (InterfaceType *)__buf;
    if (((puVar2[0xc] & 4) == 0) ||
       (p_Var4 = (pQVar8->d).static_metacall, p_Var4 == (StaticMetacallFunction)0x0)) {
      puVar3 = (this->data).d;
      uVar1 = puVar2[7];
      iVar7 = QMetaObject::propertyOffset(pQVar8);
      iVar7 = QMetaObject::metacall
                        (object,WriteProperty,
                         ((int)((ulong)((long)puVar3 - (long)puVar2) >> 2) - uVar1) / 5 + iVar7,
                         local_58);
      uVar10 = CONCAT44(extraout_var_00,iVar7);
    }
    else {
      uVar10 = (*p_Var4)(object,WriteProperty,
                         ((int)((ulong)((long)(this->data).d - (long)puVar2) >> 2) - puVar2[7]) / 5,
                         local_58);
    }
    sVar11 = CONCAT71((int7)((ulong)uVar10 >> 8),status != 0);
  }
LAB_00263bbe:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return sVar11;
}

Assistant:

bool QMetaProperty::write(QObject *object, QVariant &&v) const
{
    if (!object || !isWritable())
        return false;
    QMetaType t(mobj->d.metaTypes[data.index(mobj)]);
    if (t != QMetaType::fromType<QVariant>() && t != v.metaType()) {
        if (isEnumType() && !t.metaObject() && v.metaType() == QMetaType::fromType<QString>()) {
            // Assigning a string to a property of type Q_ENUMS (instead of Q_ENUM)
            // means the QMetaType has no associated QMetaObject, so it can't
            // do the conversion (see qmetatype.cpp:convertToEnum()).
            std::optional value = isFlagType() ? menum.keysToValue64(v.toByteArray())
                                               : menum.keyToValue64(v.toByteArray());
            if (value)
                v = QVariant(qlonglong(*value));

            // If the key(s)ToValue64 call failed, the convert() call below
            // gives QMetaType one last chance.
        }
        if (!v.isValid()) {
            if (isResettable())
                return reset(object);
            v = QVariant(t, nullptr);
        } else if (!v.convert(t)) {
            return false;
        }
    }
    // the status variable is changed by qt_metacall to indicate what it did
    // this feature is currently only used by Qt D-Bus and should not be depended
    // upon. Don't change it without looking into QDBusAbstractInterface first
    // -1 (unchanged): normal qt_metacall, result stored in argv[0]
    // changed: result stored directly in value, return the value of status
    int status = -1;
    // the flags variable is used by the declarative module to implement
    // interception of property writes.
    int flags = 0;
    void *argv[] = { nullptr, &v, &status, &flags };
    if (t == QMetaType::fromType<QVariant>())
        argv[0] = &v;
    else
        argv[0] = v.data();
    if (priv(mobj->d.data)->flags & PropertyAccessInStaticMetaCall && mobj->d.static_metacall)
        mobj->d.static_metacall(object, QMetaObject::WriteProperty, data.index(mobj), argv);
    else
        QMetaObject::metacall(object, QMetaObject::WriteProperty, data.index(mobj) + mobj->propertyOffset(), argv);

    return status;
}